

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Convolution3DLayerParams::SerializeWithCachedSizes
          (Convolution3DLayerParams *this,CodedOutputStream *output)

{
  uint8 *puVar1;
  byte *pbVar2;
  bool bVar3;
  unsigned_long *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong value;
  ulong uVar9;
  int index;
  uint value_00;
  
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->outputchannels_,output);
  }
  if (this->inputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(2,this->inputchannels_,output);
  }
  if (this->ngroups_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(10,this->ngroups_,output);
  }
  if (this->kerneldepth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x14,this->kerneldepth_,output);
  }
  if (this->kernelheight_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x15,this->kernelheight_,output);
  }
  if (this->kernelwidth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x16,this->kernelwidth_,output);
  }
  if (this->stridedepth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x1f,this->stridedepth_,output);
  }
  if (this->strideheight_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x20,this->strideheight_,output);
  }
  if (this->stridewidth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x21,this->stridewidth_,output);
  }
  if (this->dilationdepth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x28,this->dilationdepth_,output);
  }
  if (this->dilationheight_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x29,this->dilationheight_,output);
  }
  if (this->dilationwidth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x2a,this->dilationwidth_,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3c,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (Convolution3DLayerParams *)&_Convolution3DLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3d,&this->bias_->super_MessageLite,output);
  }
  if (this->paddingtype_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0x46,this->paddingtype_,output);
  }
  if (this->custompaddingfront_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x50,this->custompaddingfront_,output);
  }
  if (this->custompaddingback_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x51,this->custompaddingback_,output);
  }
  if (this->custompaddingtop_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x52,this->custompaddingtop_,output);
  }
  if (this->custompaddingbottom_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x53,this->custompaddingbottom_,output);
  }
  if (this->custompaddingleft_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x54,this->custompaddingleft_,output);
  }
  if (this->custompaddingright_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x55,this->custompaddingright_,output);
  }
  if (this->isdeconvolution_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x56,true,output);
  }
  if (0 < (this->outputshape_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x2ba);
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xba;
      puVar1[1] = '\x05';
      output->buffer_ = output->buffer_ + 2;
      output->buffer_size_ = output->buffer_size_ + -2;
    }
    value_00 = this->_outputshape_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar7 = pbVar2;
      uVar8 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar7 = (byte)value_00 | 0x80;
          uVar8 = value_00 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < value_00;
          value_00 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->outputshape_).current_size_;
  if (0 < iVar5) {
    index = 0;
    do {
      puVar4 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,index);
      value = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
      }
      else {
        pbVar2 = output->buffer_;
        pbVar7 = pbVar2;
        uVar9 = value;
        if (0x7f < value) {
          do {
            *pbVar7 = (byte)value | 0x80;
            uVar9 = value >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < value;
            value = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar2) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      index = index + 1;
    } while (index != iVar5);
  }
  return;
}

Assistant:

void Convolution3DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Convolution3DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->outputchannels(), output);
  }

  // int32 inputChannels = 2;
  if (this->inputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->inputchannels(), output);
  }

  // int32 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(10, this->ngroups(), output);
  }

  // int32 kernelDepth = 20;
  if (this->kerneldepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(20, this->kerneldepth(), output);
  }

  // int32 kernelHeight = 21;
  if (this->kernelheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(21, this->kernelheight(), output);
  }

  // int32 kernelWidth = 22;
  if (this->kernelwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(22, this->kernelwidth(), output);
  }

  // int32 strideDepth = 31;
  if (this->stridedepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(31, this->stridedepth(), output);
  }

  // int32 strideHeight = 32;
  if (this->strideheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(32, this->strideheight(), output);
  }

  // int32 strideWidth = 33;
  if (this->stridewidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(33, this->stridewidth(), output);
  }

  // int32 dilationDepth = 40;
  if (this->dilationdepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(40, this->dilationdepth(), output);
  }

  // int32 dilationHeight = 41;
  if (this->dilationheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(41, this->dilationheight(), output);
  }

  // int32 dilationWidth = 42;
  if (this->dilationwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(42, this->dilationwidth(), output);
  }

  // bool hasBias = 50;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 60;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      60, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 61;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      61, *this->bias_, output);
  }

  // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
  if (this->paddingtype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      70, this->paddingtype(), output);
  }

  // int32 customPaddingFront = 80;
  if (this->custompaddingfront() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(80, this->custompaddingfront(), output);
  }

  // int32 customPaddingBack = 81;
  if (this->custompaddingback() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(81, this->custompaddingback(), output);
  }

  // int32 customPaddingTop = 82;
  if (this->custompaddingtop() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(82, this->custompaddingtop(), output);
  }

  // int32 customPaddingBottom = 83;
  if (this->custompaddingbottom() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(83, this->custompaddingbottom(), output);
  }

  // int32 customPaddingLeft = 84;
  if (this->custompaddingleft() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(84, this->custompaddingleft(), output);
  }

  // int32 customPaddingRight = 85;
  if (this->custompaddingright() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(85, this->custompaddingright(), output);
  }

  // bool isDeconvolution = 86;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(86, this->isdeconvolution(), output);
  }

  // repeated uint64 outputShape = 87;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(87, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Convolution3DLayerParams)
}